

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O2

mapped_type_conflict * __thiscall
binlog::detail::SegmentedMap<int>::find(SegmentedMap<int> *this,key_type *key)

{
  pointer pvVar1;
  long lVar2;
  key_type kVar3;
  mapped_type_conflict *pmVar4;
  ulong uVar5;
  
  kVar3 = segmentIndex(this,*key);
  uVar5 = *key - (this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[kVar3];
  pvVar1 = (this->_segments).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pvVar1[kVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data;
  pmVar4 = (mapped_type_conflict *)0x0;
  if (uVar5 < (ulong)((long)*(pointer *)
                             ((long)&pvVar1[kVar3].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + 8) - lVar2 >> 2)) {
    pmVar4 = (mapped_type_conflict *)(lVar2 + uVar5 * 4);
  }
  return pmVar4;
}

Assistant:

const mapped_type* find(const key_type& key) const
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    const Segment& segment = _segments[si];

    if (vi < segment.size())
    {
      return & segment[vi];
    }

    return end();
  }